

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool __thiscall ImGui::NavScoreItem(ImGui *this,ImGuiNavMoveResult *result,ImRect cand)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImRect *pIVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float local_84;
  bool local_69;
  float local_68;
  float fStack_64;
  bool new_best;
  float dist_axial;
  float day;
  float dax;
  ImGuiDir quadrant;
  float dist_center;
  float dcy;
  float dcx;
  float dist_box;
  float dby;
  float dbx;
  ImRect *curr;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiNavMoveResult *result_local;
  float fStack_18;
  ImRect cand_local;
  
  pIVar2 = GImGui;
  cand_local.Min = cand.Max;
  register0x00001200 = cand.Min;
  pIVar1 = GImGui->CurrentWindow;
  if (GImGui->NavLayer == (pIVar1->DC).NavLayerCurrent) {
    pIVar4 = &GImGui->NavScoringRectScreen;
    GImGui->NavScoringCount = GImGui->NavScoringCount + 1;
    if (pIVar1->ParentWindow == pIVar2->NavWindow) {
      if (((pIVar1->Flags | pIVar2->NavWindow->Flags) & 0x800000U) == 0) {
        __assert_fail("(window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                      ,0x1e01,"bool ImGui::NavScoreItem(ImGuiNavMoveResult *, ImRect)");
      }
      bVar3 = ImRect::Overlaps(&pIVar1->ClipRect,(ImRect *)((long)&result_local + 4));
      if (!bVar3) {
        return false;
      }
      ImRect::ClipWithFull((ImRect *)((long)&result_local + 4),&pIVar1->ClipRect);
    }
    NavClampRectToVisibleAreaForMoveDir
              (pIVar2->NavMoveClipDir,(ImRect *)((long)&result_local + 4),&pIVar1->ClipRect);
    dist_box = NavScoreItemDistInterval
                         (result_local._4_4_,cand_local.Min.x,(pIVar4->Min).x,
                          (pIVar2->NavScoringRectScreen).Max.x);
    fVar5 = ImLerp<float>(fStack_18,cand_local.Min.y,0.2);
    fVar6 = ImLerp<float>(fStack_18,cand_local.Min.y,0.8);
    fVar7 = ImLerp<float>((pIVar2->NavScoringRectScreen).Min.y,(pIVar2->NavScoringRectScreen).Max.y,
                          0.2);
    fVar8 = ImLerp<float>((pIVar2->NavScoringRectScreen).Min.y,(pIVar2->NavScoringRectScreen).Max.y,
                          0.8);
    local_84 = NavScoreItemDistInterval(fVar5,fVar6,fVar7,fVar8);
    if (((local_84 != 0.0) || (NAN(local_84))) && ((dist_box != 0.0 || (NAN(dist_box))))) {
      dist_box = dist_box / 1000.0 +
                 (float)(~-(uint)(0.0 < dist_box) & 0xbf800000 |
                        -(uint)(0.0 < dist_box) & 0x3f800000);
    }
    fVar6 = ImFabs(dist_box);
    fVar5 = ImFabs(local_84);
    fVar6 = fVar6 + fVar5;
    fVar5 = (result_local._4_4_ + cand_local.Min.x) -
            ((pIVar4->Min).x + (pIVar2->NavScoringRectScreen).Max.x);
    fVar7 = (fStack_18 + cand_local.Min.y) -
            ((pIVar2->NavScoringRectScreen).Min.y + (pIVar2->NavScoringRectScreen).Max.y);
    fVar9 = ImFabs(fVar5);
    fVar8 = ImFabs(fVar7);
    fVar9 = fVar9 + fVar8;
    dist_axial = 0.0;
    fStack_64 = 0.0;
    local_68 = 0.0;
    if (((dist_box != 0.0) || (local_84 != 0.0)) || (NAN(local_84))) {
      dist_axial = dist_box;
      day = (float)ImGetDirQuadrantFromDelta(dist_box,local_84);
      local_68 = fVar6;
      fStack_64 = local_84;
    }
    else if (((fVar5 != 0.0) || (fVar7 != 0.0)) || (NAN(fVar7))) {
      day = (float)ImGetDirQuadrantFromDelta(fVar5,fVar7);
      local_68 = fVar9;
      fStack_64 = fVar7;
      dist_axial = fVar5;
    }
    else {
      day = (float)(uint)(pIVar2->NavId <= (pIVar1->DC).LastItemId);
    }
    local_69 = false;
    if (day == (float)pIVar2->NavMoveDir) {
      if (fVar6 < *(float *)(this + 0x10)) {
        *(float *)(this + 0x10) = fVar6;
        *(float *)(this + 0x14) = fVar9;
        return true;
      }
      if ((fVar6 == *(float *)(this + 0x10)) && (!NAN(fVar6) && !NAN(*(float *)(this + 0x10)))) {
        if (*(float *)(this + 0x14) <= fVar9) {
          if ((fVar9 == *(float *)(this + 0x14)) && (!NAN(fVar9) && !NAN(*(float *)(this + 0x14))))
          {
            if ((pIVar2->NavMoveDir != 2) && (pIVar2->NavMoveDir != 3)) {
              local_84 = dist_box;
            }
            local_69 = local_84 < 0.0;
          }
        }
        else {
          *(float *)(this + 0x14) = fVar9;
          local_69 = true;
        }
      }
    }
    if (((((*(float *)(this + 0x10) == 3.4028235e+38) && (!NAN(*(float *)(this + 0x10)))) &&
         (local_68 < *(float *)(this + 0x18))) &&
        ((pIVar2->NavLayer == ImGuiNavLayer_Menu && ((pIVar2->NavWindow->Flags & 0x10000000U) == 0))
        )) && (((((pIVar2->NavMoveDir == 0 && (dist_axial < 0.0)) ||
                 ((pIVar2->NavMoveDir == 1 && (0.0 < dist_axial)))) ||
                ((pIVar2->NavMoveDir == 2 && (fStack_64 < 0.0)))) ||
               ((pIVar2->NavMoveDir == 3 && (0.0 < fStack_64)))))) {
      *(float *)(this + 0x18) = local_68;
      local_69 = true;
    }
    cand_local.Max.x._3_1_ = local_69;
  }
  else {
    cand_local.Max.x._3_1_ = false;
  }
  return cand_local.Max.x._3_1_;
}

Assistant:

static bool ImGui::NavScoreItem(ImGuiNavMoveResult* result, ImRect cand)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.NavLayer != window->DC.NavLayerCurrent)
        return false;

    const ImRect& curr = g.NavScoringRectScreen; // Current modified source rect (NB: we've applied Max.x = Min.x in NavUpdate() to inhibit the effect of having varied item width)
    g.NavScoringCount++;

    // When entering through a NavFlattened border, we consider child window items as fully clipped for scoring
    if (window->ParentWindow == g.NavWindow)
    {
        IM_ASSERT((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened);
        if (!window->ClipRect.Overlaps(cand))
            return false;
        cand.ClipWithFull(window->ClipRect); // This allows the scored item to not overlap other candidates in the parent window
    }

    // We perform scoring on items bounding box clipped by the current clipping rectangle on the other axis (clipping on our movement axis would give us equal scores for all clipped items)
    // For example, this ensure that items in one column are not reached when moving vertically from items in another column.
    NavClampRectToVisibleAreaForMoveDir(g.NavMoveClipDir, cand, window->ClipRect);

    // Compute distance between boxes
    // FIXME-NAV: Introducing biases for vertical navigation, needs to be removed.
    float dbx = NavScoreItemDistInterval(cand.Min.x, cand.Max.x, curr.Min.x, curr.Max.x);
    float dby = NavScoreItemDistInterval(ImLerp(cand.Min.y, cand.Max.y, 0.2f), ImLerp(cand.Min.y, cand.Max.y, 0.8f), ImLerp(curr.Min.y, curr.Max.y, 0.2f), ImLerp(curr.Min.y, curr.Max.y, 0.8f)); // Scale down on Y to keep using box-distance for vertically touching items
    if (dby != 0.0f && dbx != 0.0f)
       dbx = (dbx/1000.0f) + ((dbx > 0.0f) ? +1.0f : -1.0f);
    float dist_box = ImFabs(dbx) + ImFabs(dby);

    // Compute distance between centers (this is off by a factor of 2, but we only compare center distances with each other so it doesn't matter)
    float dcx = (cand.Min.x + cand.Max.x) - (curr.Min.x + curr.Max.x);
    float dcy = (cand.Min.y + cand.Max.y) - (curr.Min.y + curr.Max.y);
    float dist_center = ImFabs(dcx) + ImFabs(dcy); // L1 metric (need this for our connectedness guarantee)

    // Determine which quadrant of 'curr' our candidate item 'cand' lies in based on distance
    ImGuiDir quadrant;
    float dax = 0.0f, day = 0.0f, dist_axial = 0.0f;
    if (dbx != 0.0f || dby != 0.0f)
    {
        // For non-overlapping boxes, use distance between boxes
        dax = dbx;
        day = dby;
        dist_axial = dist_box;
        quadrant = ImGetDirQuadrantFromDelta(dbx, dby);
    }
    else if (dcx != 0.0f || dcy != 0.0f)
    {
        // For overlapping boxes with different centers, use distance between centers
        dax = dcx;
        day = dcy;
        dist_axial = dist_center;
        quadrant = ImGetDirQuadrantFromDelta(dcx, dcy);
    }
    else
    {
        // Degenerate case: two overlapping buttons with same center, break ties arbitrarily (note that LastItemId here is really the _previous_ item order, but it doesn't matter)
        quadrant = (window->DC.LastItemId < g.NavId) ? ImGuiDir_Left : ImGuiDir_Right;
    }

#if IMGUI_DEBUG_NAV_SCORING
    char buf[128];
    if (IsMouseHoveringRect(cand.Min, cand.Max))
    {
        ImFormatString(buf, IM_ARRAYSIZE(buf), "dbox (%.2f,%.2f->%.4f)\ndcen (%.2f,%.2f->%.4f)\nd (%.2f,%.2f->%.4f)\nnav %c, quadrant %c", dbx, dby, dist_box, dcx, dcy, dist_center, dax, day, dist_axial, "WENS"[g.NavMoveDir], "WENS"[quadrant]);
        ImDrawList* draw_list = GetForegroundDrawList(window);
        draw_list->AddRect(curr.Min, curr.Max, IM_COL32(255,200,0,100));
        draw_list->AddRect(cand.Min, cand.Max, IM_COL32(255,255,0,200));
        draw_list->AddRectFilled(cand.Max - ImVec2(4,4), cand.Max + CalcTextSize(buf) + ImVec2(4,4), IM_COL32(40,0,0,150));
        draw_list->AddText(g.IO.FontDefault, 13.0f, cand.Max, ~0U, buf);
    }
    else if (g.IO.KeyCtrl) // Hold to preview score in matching quadrant. Press C to rotate.
    {
        if (IsKeyPressedMap(ImGuiKey_C)) { g.NavMoveDirLast = (ImGuiDir)((g.NavMoveDirLast + 1) & 3); g.IO.KeysDownDuration[g.IO.KeyMap[ImGuiKey_C]] = 0.01f; }
        if (quadrant == g.NavMoveDir)
        {
            ImFormatString(buf, IM_ARRAYSIZE(buf), "%.0f/%.0f", dist_box, dist_center);
            ImDrawList* draw_list = GetForegroundDrawList(window);
            draw_list->AddRectFilled(cand.Min, cand.Max, IM_COL32(255, 0, 0, 200));
            draw_list->AddText(g.IO.FontDefault, 13.0f, cand.Min, IM_COL32(255, 255, 255, 255), buf);
        }
    }
 #endif

    // Is it in the quadrant we're interesting in moving to?
    bool new_best = false;
    if (quadrant == g.NavMoveDir)
    {
        // Does it beat the current best candidate?
        if (dist_box < result->DistBox)
        {
            result->DistBox = dist_box;
            result->DistCenter = dist_center;
            return true;
        }
        if (dist_box == result->DistBox)
        {
            // Try using distance between center points to break ties
            if (dist_center < result->DistCenter)
            {
                result->DistCenter = dist_center;
                new_best = true;
            }
            else if (dist_center == result->DistCenter)
            {
                // Still tied! we need to be extra-careful to make sure everything gets linked properly. We consistently break ties by symbolically moving "later" items
                // (with higher index) to the right/downwards by an infinitesimal amount since we the current "best" button already (so it must have a lower index),
                // this is fairly easy. This rule ensures that all buttons with dx==dy==0 will end up being linked in order of appearance along the x axis.
                if (((g.NavMoveDir == ImGuiDir_Up || g.NavMoveDir == ImGuiDir_Down) ? dby : dbx) < 0.0f) // moving bj to the right/down decreases distance
                    new_best = true;
            }
        }
    }

    // Axial check: if 'curr' has no link at all in some direction and 'cand' lies roughly in that direction, add a tentative link. This will only be kept if no "real" matches
    // are found, so it only augments the graph produced by the above method using extra links. (important, since it doesn't guarantee strong connectedness)
    // This is just to avoid buttons having no links in a particular direction when there's a suitable neighbor. you get good graphs without this too.
    // 2017/09/29: FIXME: This now currently only enabled inside menu bars, ideally we'd disable it everywhere. Menus in particular need to catch failure. For general navigation it feels awkward.
    // Disabling it may lead to disconnected graphs when nodes are very spaced out on different axis. Perhaps consider offering this as an option?
    if (result->DistBox == FLT_MAX && dist_axial < result->DistAxial)  // Check axial match
        if (g.NavLayer == 1 && !(g.NavWindow->Flags & ImGuiWindowFlags_ChildMenu))
            if ((g.NavMoveDir == ImGuiDir_Left && dax < 0.0f) || (g.NavMoveDir == ImGuiDir_Right && dax > 0.0f) || (g.NavMoveDir == ImGuiDir_Up && day < 0.0f) || (g.NavMoveDir == ImGuiDir_Down && day > 0.0f))
            {
                result->DistAxial = dist_axial;
                new_best = true;
            }

    return new_best;
}